

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serfloat_tests.cpp
# Opt level: O1

void __thiscall serfloat_tests::doubles::test_method(doubles *this)

{
  uint uVar1;
  bool bVar2;
  size_t __nbytes;
  int i;
  int iVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  const_string file;
  Span<unsigned_char> output;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  double j;
  uint256 result;
  uint64_t obj;
  check_type cVar8;
  assertion_result local_1a0;
  char *local_188;
  assertion_result local_180;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  uint local_13c;
  char *local_138;
  char *local_130;
  lazy_ostream local_128;
  undefined ***local_118;
  char **local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  DataStream local_e8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  undefined8 *local_98;
  uint *puStack_90;
  uchar local_88 [80];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_e8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.m_read_pos = 0;
  local_e8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar3 = 0;
  do {
    local_a8._0_8_ = EncodeDouble((double)iVar3);
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)&local_e8,
               local_e8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_finish,local_a8,local_a8 + 8);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 1000);
  local_f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_f0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x8e;
  file.m_begin = (iterator)&local_f8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_108,msg);
  local_b8 = (lazy_ostream *)0x0;
  uStack_b0 = (char *)0x0;
  local_c8 = (undefined **)0x0;
  uStack_c0 = 0;
  local_88[0x30] = '\0';
  local_88[0x31] = '\0';
  local_88[0x32] = '\0';
  local_88[0x33] = '\0';
  local_88[0x34] = '\0';
  local_88[0x35] = '\0';
  local_88[0x36] = '\0';
  local_88[0x37] = '\0';
  local_88[0x38] = '\0';
  local_88[0x39] = '\0';
  local_88[0x3a] = '\0';
  local_88[0x3b] = '\0';
  local_88[0x3c] = '\0';
  local_88[0x3d] = '\0';
  local_88[0x3e] = '\0';
  local_88[0x3f] = '\0';
  local_88[0x20] = '\0';
  local_88[0x21] = '\0';
  local_88[0x22] = '\0';
  local_88[0x23] = '\0';
  local_88[0x24] = '\0';
  local_88[0x25] = '\0';
  local_88[0x26] = '\0';
  local_88[0x27] = '\0';
  local_88[0x28] = '\0';
  local_88[0x29] = '\0';
  local_88[0x2a] = '\0';
  local_88[0x2b] = '\0';
  local_88[0x2c] = '\0';
  local_88[0x2d] = '\0';
  local_88[0x2e] = '\0';
  local_88[0x2f] = '\0';
  local_88[0x10] = '\0';
  local_88[0x11] = '\0';
  local_88[0x12] = '\0';
  local_88[0x13] = '\0';
  local_88[0x14] = '\0';
  local_88[0x15] = '\0';
  local_88[0x16] = '\0';
  local_88[0x17] = '\0';
  local_88[0x18] = '\0';
  local_88[0x19] = '\0';
  local_88[0x1a] = '\0';
  local_88[0x1b] = '\0';
  local_88[0x1c] = '\0';
  local_88[0x1d] = '\0';
  local_88[0x1e] = '\0';
  local_88[0x1f] = '\0';
  local_88[0] = '\0';
  local_88[1] = '\0';
  local_88[2] = '\0';
  local_88[3] = '\0';
  local_88[4] = '\0';
  local_88[5] = '\0';
  local_88[6] = '\0';
  local_88[7] = '\0';
  local_88[8] = '\0';
  local_88[9] = '\0';
  local_88[10] = '\0';
  local_88[0xb] = '\0';
  local_88[0xc] = '\0';
  local_88[0xd] = '\0';
  local_88[0xe] = '\0';
  local_88[0xf] = '\0';
  local_98 = (undefined8 *)0x0;
  puStack_90 = (uint *)0x0;
  local_a8._0_8_ = (_func_int **)0x0;
  local_a8._8_8_ = 0;
  local_88[0x40] = '\0';
  local_88[0x41] = '\0';
  local_88[0x42] = '\0';
  local_88[0x43] = '\0';
  local_88[0x44] = '\0';
  local_88[0x45] = '\0';
  local_88[0x46] = '\0';
  local_88[0x47] = '\0';
  CSHA256::CSHA256((CSHA256 *)local_a8);
  CSHA256::Write((CSHA256 *)local_a8,
                 local_e8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                 _M_impl.super__Vector_impl_data._M_start + local_e8.m_read_pos,
                 (long)local_e8.vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(local_e8.vch.
                        super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
                        .super__Vector_impl_data._M_start + local_e8.m_read_pos));
  output.m_size = 0x20;
  output.m_data = (uchar *)&local_c8;
  CHash256::Finalize((CHash256 *)local_a8,output);
  local_a8._0_8_ = (_func_int **)0x557f0d7878b23f96;
  local_a8._8_8_ = 0xa01585d25b25d433;
  local_98 = (undefined8 *)0xafe114590d392676;
  puStack_90 = (uint *)0x43d0c82591953c4e;
  auVar7[0] = -((char)local_b8 == 'v');
  auVar7[1] = -(local_b8._1_1_ == '&');
  auVar7[2] = -(local_b8._2_1_ == '9');
  auVar7[3] = -(local_b8._3_1_ == '\r');
  auVar7[4] = -(local_b8._4_1_ == 'Y');
  auVar7[5] = -(local_b8._5_1_ == '\x14');
  auVar7[6] = -(local_b8._6_1_ == -0x1f);
  auVar7[7] = -(local_b8._7_1_ == -0x51);
  auVar7[8] = -((char)uStack_b0 == 'N');
  auVar7[9] = -(uStack_b0._1_1_ == '<');
  auVar7[10] = -(uStack_b0._2_1_ == -0x6b);
  auVar7[0xb] = -(uStack_b0._3_1_ == -0x6f);
  auVar7[0xc] = -(uStack_b0._4_1_ == '%');
  auVar7[0xd] = -(uStack_b0._5_1_ == -0x38);
  auVar7[0xe] = -(uStack_b0._6_1_ == -0x30);
  auVar7[0xf] = -(uStack_b0._7_1_ == 'C');
  auVar6[0] = -((uchar)local_c8 == 0x96);
  auVar6[1] = -(local_c8._1_1_ == '?');
  auVar6[2] = -(local_c8._2_1_ == -0x4e);
  auVar6[3] = -(local_c8._3_1_ == 'x');
  auVar6[4] = -(local_c8._4_1_ == 'x');
  auVar6[5] = -(local_c8._5_1_ == '\r');
  auVar6[6] = -(local_c8._6_1_ == '\x7f');
  auVar6[7] = -(local_c8._7_1_ == 'U');
  auVar6[8] = -((char)uStack_c0 == '3');
  auVar6[9] = -(uStack_c0._1_1_ == -0x2c);
  auVar6[10] = -(uStack_c0._2_1_ == '%');
  auVar6[0xb] = -(uStack_c0._3_1_ == '[');
  auVar6[0xc] = -(uStack_c0._4_1_ == -0x2e);
  auVar6[0xd] = -(uStack_c0._5_1_ == -0x7b);
  auVar6[0xe] = -(uStack_c0._6_1_ == '\x15');
  auVar6[0xf] = -(uStack_c0._7_1_ == -0x60);
  auVar6 = auVar6 & auVar7;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) == 0xffff);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110 = (char **)&local_180;
  local_180._0_8_ =
       "Hash(ss) == uint256{\"43d0c82591953c4eafe114590d392676a01585d25b25d433557f0d7878b23f96\"}";
  local_180.m_message.px = (element_type *)0xf351db;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_118 = (undefined ***)boost::unit_test::lazy_ostream::inst;
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_130 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  __nbytes = 0x8e;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_128,1,0,WARN,_cVar8,(size_t)&local_138,0x8e);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  local_13c = 0;
  do {
    DataStream::read(&local_e8,(int)(lazy_ostream *)local_a8,&DAT_00000008,__nbytes);
    local_148 = (char *)DecodeDouble(local_a8._0_8_);
    local_158 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
    ;
    local_150 = "";
    local_168 = &boost::unit_test::basic_cstring<char_const>::null;
    local_160 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x95;
    file_00.m_begin = (iterator)&local_158;
    msg_00.m_end = pvVar5;
    msg_00.m_begin = pvVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_168,
               msg_00);
    local_180.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)((double)(int)local_13c == (double)local_148);
    local_180.m_message.px = (element_type *)0x0;
    local_180.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_1a0.m_message.px = (element_type *)(local_1a0.m_message._1_8_ << 8);
    local_1a0._0_8_ = &PTR__lazy_ostream_013d8398;
    local_1a0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_188 = "decoded:";
    local_128.m_empty = false;
    local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d83d8;
    local_118 = (undefined ***)&local_1a0;
    local_110 = &local_148;
    uStack_c0 = uStack_c0 & 0xffffffffffffff00;
    local_c8 = &PTR__lazy_ostream_013d8418;
    local_b8 = &local_128;
    uStack_b0 = " expected:";
    local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
    local_a8._0_8_ = &PTR__lazy_ostream_013d8458;
    local_98 = &local_c8;
    puStack_90 = &local_13c;
    pvVar4 = (iterator)0x1;
    pvVar5 = (iterator)0x1;
    boost::test_tools::tt_detail::report_assertion
              (&local_180,(lazy_ostream *)local_a8,1,1,WARN,0xf34510,
               (size_t)&stack0xfffffffffffffe50,0x95);
    boost::detail::shared_count::~shared_count(&local_180.m_message.pn);
    uVar1 = local_13c + 1;
    __nbytes = (size_t)uVar1;
    bVar2 = (int)local_13c < 999;
    local_13c = uVar1;
  } while (bVar2);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_e8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(doubles)
{
    DataStream ss{};
    // encode
    for (int i = 0; i < 1000; i++) {
        ss << EncodeDouble(i);
    }
    BOOST_CHECK(Hash(ss) == uint256{"43d0c82591953c4eafe114590d392676a01585d25b25d433557f0d7878b23f96"});

    // decode
    for (int i = 0; i < 1000; i++) {
        uint64_t val;
        ss >> val;
        double j = DecodeDouble(val);
        BOOST_CHECK_MESSAGE(i == j, "decoded:" << j << " expected:" << i);
    }
}